

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

bool __thiscall mapbox::detail::Earcut<unsigned_int>::isEar(Earcut<unsigned_int> *this,Node *ear)

{
  Node *p;
  Node *r;
  bool bVar1;
  Node *q;
  bool bVar2;
  double dVar3;
  
  p = ear->prev;
  r = ear->next;
  dVar3 = area(this,p,ear,r);
  if (0.0 <= dVar3) {
    bVar2 = false;
  }
  else {
    q = ear->next;
    do {
      q = q->next;
      bVar2 = q == ear->prev;
      if (bVar2) {
        return bVar2;
      }
      bVar1 = pointInTriangle(this,p->x,p->y,ear->x,ear->y,r->x,r->y,q->x,q->y);
    } while ((!bVar1) || (dVar3 = area(this,q->prev,q,q->next), dVar3 < 0.0));
  }
  return bVar2;
}

Assistant:

bool Earcut<N>::isEar(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // now make sure we don't have other points inside the potential ear
    Node* p = ear->next->next;

    while (p != ear->prev) {
        if (pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->next;
    }

    return true;
}